

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O2

double __thiscall
trento::NucleonCommon::thickness(NucleonCommon *this,NucleonData *nucleon,double x,double y)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer pCVar6;
  double dVar7;
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 extraout_var [56];
  
  auVar9._8_56_ = in_register_00001248;
  auVar9._0_8_ = y;
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = x;
  pCVar6 = (nucleon->constituents_).
           super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (nucleon->constituents_).
           super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auVar5 = vunpcklpd_avx(auVar11._0_16_,auVar9._0_16_);
  auVar11 = ZEXT864(0) << 0x40;
  for (; auVar10._0_8_ = auVar11._0_8_, pCVar6 != pCVar3; pCVar6 = pCVar6 + 1) {
    auVar4._0_8_ = pCVar6->x;
    auVar4._8_8_ = pCVar6->y;
    auVar4 = vsubpd_avx(auVar5,auVar4);
    dVar7 = auVar4._0_8_ * auVar4._0_8_ + auVar4._8_8_ * auVar4._8_8_;
    if (dVar7 < this->constituent_radius_sq_) {
      dVar1 = pCVar6->fluctuation;
      auVar8._0_8_ = FastExp<double>::operator()
                               (&this->fast_exp_,(dVar7 * -0.5) / this->constituent_width_sq_);
      auVar8._8_56_ = extraout_var;
      auVar10._8_8_ = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = dVar1;
      auVar10 = vfmadd231sd_fma(auVar10,auVar8._0_16_,auVar2);
      auVar11 = ZEXT1664(auVar10);
    }
  }
  return auVar10._0_8_ * this->prefactor_;
}

Assistant:

inline double NucleonCommon::thickness(
    const NucleonData& nucleon, double x, double y) const {
  auto t = 0.;

  for (const auto& constituent : nucleon.constituents_) {
    auto fluct = constituent.fluctuation;
    auto distance_sq = sqr(x - constituent.x) + sqr(y - constituent.y);
    if (distance_sq < constituent_radius_sq_)
      t += fluct * fast_exp_(-.5*distance_sq/constituent_width_sq_);
  }

  return prefactor_ * t;
}